

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::
     RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYRef<unsigned_char>,ImPlot::TransformerLinLog>>
               (LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLog>
                *renderer,ImDrawList *DrawList,ImRect *cull_rect)

{
  bool bVar1;
  float fVar2;
  float local_38;
  uint ie;
  uint cnt;
  ImVec2 uv;
  uint idx;
  uint prims_culled;
  uint prims;
  ImRect *cull_rect_local;
  ImDrawList *DrawList_local;
  LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLog>
  *renderer_local;
  
  idx = renderer->Prims;
  uv.y = 0.0;
  uv.x = 0.0;
  _ie = DrawList->_Data->TexUvWhitePixel;
  while (idx != 0) {
    local_38 = (float)ImMin<unsigned_int>(idx,0xffff - DrawList->_VtxCurrentIdx >> 2);
    fVar2 = (float)ImMin<unsigned_int>(0x40,idx);
    if ((uint)local_38 < (uint)fVar2) {
      if (uv.y != 0.0) {
        ImDrawList::PrimUnreserve(DrawList,(int)uv.y * 6,(int)uv.y << 2);
        uv.y = 0.0;
      }
      local_38 = (float)ImMin<unsigned_int>(idx,0x3fff);
      ImDrawList::PrimReserve(DrawList,(int)local_38 * 6,(int)local_38 << 2);
    }
    else if ((uint)uv.y < (uint)local_38) {
      ImDrawList::PrimReserve
                (DrawList,((int)local_38 - (int)uv.y) * 6,((int)local_38 - (int)uv.y) * 4);
      uv.y = 0.0;
    }
    else {
      uv.y = (float)((int)uv.y - (int)local_38);
    }
    idx = idx - (int)local_38;
    local_38 = (float)((int)uv.x + (int)local_38);
    for (; uv.x != local_38; uv.x = (float)((int)uv.x + 1)) {
      bVar1 = LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLog>
              ::operator()(renderer,DrawList,cull_rect,(ImVec2 *)&ie,(int)uv.x);
      if (!bVar1) {
        uv.y = (float)((int)uv.y + 1);
      }
    }
  }
  if (uv.y != 0.0) {
    ImDrawList::PrimUnreserve(DrawList,(int)uv.y * 6,(int)uv.y << 2);
  }
  return;
}

Assistant:

inline void RenderPrimitives(const Renderer& renderer, ImDrawList& DrawList, const ImRect& cull_rect) {
    unsigned int prims        = renderer.Prims;
    unsigned int prims_culled = 0;
    unsigned int idx          = 0;
    const ImVec2 uv = DrawList._Data->TexUvWhitePixel;
    while (prims) {
        // find how many can be reserved up to end of current draw command's limit
        unsigned int cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - DrawList._VtxCurrentIdx) / Renderer::VtxConsumed);
        // make sure at least this many elements can be rendered to avoid situations where at the end of buffer this slow path is not taken all the time
        if (cnt >= ImMin(64u, prims)) {
            if (prims_culled >= cnt)
                prims_culled -= cnt; // reuse previous reservation
            else {
                DrawList.PrimReserve((cnt - prims_culled) * Renderer::IdxConsumed, (cnt - prims_culled) * Renderer::VtxConsumed); // add more elements to previous reservation
                prims_culled = 0;
            }
        }
        else
        {
            if (prims_culled > 0) {
                DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
                prims_culled = 0;
            }
            cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - 0/*DrawList._VtxCurrentIdx*/) / Renderer::VtxConsumed);
            DrawList.PrimReserve(cnt * Renderer::IdxConsumed, cnt * Renderer::VtxConsumed); // reserve new draw command
        }
        prims -= cnt;
        for (unsigned int ie = idx + cnt; idx != ie; ++idx) {
            if (!renderer(DrawList, cull_rect, uv, idx))
                prims_culled++;
        }
    }
    if (prims_culled > 0)
        DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
}